

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

void __thiscall
Fad<double>::
Fad<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>>>
          (Fad<double> *this,
          FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  uint uVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  value_type vVar9;
  
  pFVar3 = (fadexpr->fadexpr_).expr_.fadexpr_.left_;
  pFVar4 = (fadexpr->fadexpr_).expr_.fadexpr_.right_;
  dVar8 = ((pFVar4->fadexpr_).left_)->val_ * ((pFVar4->fadexpr_).right_)->val_ +
          ((pFVar3->fadexpr_).left_)->val_ * ((pFVar3->fadexpr_).right_)->val_;
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  this->val_ = dVar8;
  pFVar3 = (fadexpr->fadexpr_).expr_.fadexpr_.left_;
  uVar1 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  pFVar4 = (fadexpr->fadexpr_).expr_.fadexpr_.right_;
  uVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar5 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar5 < (int)uVar1) {
    uVar5 = uVar1;
  }
  if ((int)uVar5 < (int)uVar2) {
    uVar5 = uVar2;
  }
  (this->dx_).num_elts = 0;
  (this->dx_).ptr_to_data = (double *)0x0;
  if (0 < (int)uVar5) {
    (this->dx_).num_elts = uVar5;
    pdVar6 = (double *)operator_new__((ulong)uVar5 << 3);
    (this->dx_).ptr_to_data = pdVar6;
  }
  this->defaultVal = 0.0;
  uVar1 = (((pFVar3->fadexpr_).left_)->dx_).num_elts;
  uVar2 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar2 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar1 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar5 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar5 < (int)uVar1) {
    uVar5 = uVar1;
  }
  if ((int)uVar5 < (int)uVar2) {
    uVar5 = uVar2;
  }
  if (0 < (int)uVar5) {
    uVar7 = 0;
    do {
      vVar9 = FadExpr<FadFuncSqrt<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
              ::dx(fadexpr,(int)uVar7);
      (this->dx_).ptr_to_data[uVar7] = vVar9;
      uVar7 = uVar7 + 1;
    } while (uVar5 != uVar7);
  }
  return;
}

Assistant:

inline Fad(const FadExpr<ExprT>& fadexpr) : 
    val_(fadexpr.val()), 
    dx_(fadexpr.size()), 
    defaultVal(T(0))
    {
      int sz = fadexpr.size();

      if ( sz ) {
        for(int i=0; i<sz; ++i) 
          dx_[i] = fadexpr.dx(i);
      }
    }